

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hrec_t * bcf_hdr_parse_line(bcf_hdr_t *h,char *line,int *len)

{
  bool bVar1;
  char cVar2;
  bcf_hrec_t *hrec;
  char *pcVar3;
  ushort **ppuVar4;
  char cVar5;
  int len_00;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  size_t __n;
  bool bVar12;
  kstring_t tmp;
  kstring_t local_48;
  
  if ((*line == '#') && (line[1] == '#')) {
    lVar9 = 0;
    for (lVar10 = 3; (cVar2 = line[lVar10 + -1], cVar2 != '\0' && (cVar2 != '='));
        lVar10 = lVar10 + 1) {
      lVar9 = lVar9 + 0x100000000;
    }
    if ((cVar2 == '=') && (uVar6 = lVar10 - 3, (uVar6 & 0xffffffff) != 0)) {
      hrec = (bcf_hrec_t *)calloc(1,0x30);
      pcVar3 = (char *)malloc(lVar9 + 0x100000000 >> 0x20);
      hrec->key = pcVar3;
      memcpy(pcVar3,line + 2,lVar9 >> 0x20);
      pcVar3[lVar9 >> 0x20] = '\0';
      pcVar3 = line + lVar10;
      if (line[lVar10] != '<') {
        __n = 0;
        for (; (line[uVar6 + 3] != '\0' && (line[uVar6 + 3] != '\n')); uVar6 = uVar6 + 1) {
          __n = __n + 1;
        }
        pcVar11 = (char *)malloc(__n + 1);
        hrec->value = pcVar11;
        memcpy(pcVar11,pcVar3,__n);
        pcVar11[__n] = '\0';
        *len = (int)uVar6 + 4;
        return hrec;
      }
      cVar2 = *pcVar3;
      if (cVar2 != '\0') {
        iVar7 = 1;
        do {
          if ((cVar2 == '\n') || (iVar7 == 0)) break;
          cVar2 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
          pcVar11 = pcVar3;
          if (cVar2 == '\0') {
            bVar12 = false;
          }
          else {
            ppuVar4 = __ctype_b_loc();
            do {
              if (((*ppuVar4)[cVar2] & 8) == 0) break;
              cVar2 = pcVar11[1];
              pcVar11 = pcVar11 + 1;
            } while (cVar2 != '\0');
            bVar12 = cVar2 == '=';
          }
          if ((!bVar12) || (len_00 = (int)pcVar11 - (int)pcVar3, len_00 == 0)) {
            iVar7 = (int)pcVar11 - (int)line;
            for (; (*pcVar11 != '\0' && (*pcVar11 != '\n')); pcVar11 = pcVar11 + 1) {
              iVar7 = iVar7 + 1;
            }
            local_48.l = 0;
            local_48.m = 0;
            local_48.s = (char *)0x0;
            kputsn(line,iVar7,&local_48);
            pcVar3 = local_48.s;
            fprintf(_stderr,"Could not parse the header line: \"%s\"\n",local_48.s);
            free(pcVar3);
            *len = iVar7 + 1;
            bcf_hrec_destroy(hrec);
            return (bcf_hrec_t *)0x0;
          }
          bcf_hrec_add_key(hrec,pcVar3,len_00);
          cVar2 = pcVar11[1];
          bVar12 = cVar2 == '\"';
          pcVar3 = pcVar11 + 1;
          if (bVar12) {
            pcVar3 = pcVar11 + 2;
          }
          cVar5 = pcVar11[(ulong)bVar12 + 1];
          pcVar11 = pcVar3;
          while (cVar5 != '\0') {
            if (cVar2 == '\"') {
              if (cVar5 == '\"') {
                pcVar8 = pcVar11 + -1;
                if (pcVar8 < pcVar3) break;
                bVar1 = false;
                do {
                  if (*pcVar8 != '\\') break;
                  bVar1 = (bool)(bVar1 ^ 1);
                  pcVar8 = pcVar8 + -1;
                } while (pcVar3 <= pcVar8);
                if (!bVar1) break;
              }
            }
            else {
              iVar7 = (iVar7 + (uint)(cVar5 == '<')) - (uint)(cVar5 == '>');
              if (iVar7 == 0) {
                iVar7 = 0;
                break;
              }
              if ((cVar5 == ',') && (iVar7 == 1)) {
                iVar7 = 1;
                break;
              }
            }
            pcVar8 = pcVar11 + 1;
            pcVar11 = pcVar11 + 1;
            cVar5 = *pcVar8;
          }
          uVar6 = (ulong)(cVar2 == '\"');
          bcf_hrec_set_val(hrec,hrec->nkeys + -1,pcVar3,(int)pcVar11 - (int)pcVar3,(uint)bVar12);
          bVar12 = pcVar11[uVar6] == '>';
          pcVar3 = pcVar11 + bVar12 + uVar6;
          iVar7 = iVar7 - (uint)bVar12;
          cVar2 = pcVar11[bVar12 + uVar6];
        } while (cVar2 != '\0');
      }
      *len = ((int)pcVar3 - (int)line) + 1;
      return hrec;
    }
    *len = (int)lVar10;
  }
  else {
    *len = 0;
  }
  return (bcf_hrec_t *)0x0;
}

Assistant:

bcf_hrec_t *bcf_hdr_parse_line(const bcf_hdr_t *h, const char *line, int *len)
{
    const char *p = line;
    if (p[0] != '#' || p[1] != '#') { *len = 0; return NULL; }
    p += 2;

    const char *q = p;
    while ( *q && *q!='=' ) q++;
    int n = q-p;
    if ( *q!='=' || !n ) { *len = q-line+1; return NULL; } // wrong format

    bcf_hrec_t *hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    hrec->key = (char*) malloc(sizeof(char)*(n+1));
    memcpy(hrec->key,p,n);
    hrec->key[n] = 0;

    p = ++q;
    if ( *p!='<' ) // generic field, e.g. ##samtoolsVersion=0.1.18-r579
    {
        while ( *q && *q!='\n' ) q++;
        hrec->value = (char*) malloc((q-p+1)*sizeof(char));
        memcpy(hrec->value, p, q-p);
        hrec->value[q-p] = 0;
        *len = q-line+1;
        return hrec;
    }

    // structured line, e.g. ##INFO=<ID=PV1,Number=1,Type=Float,Description="P-value for baseQ bias">
    int nopen = 1;
    while ( *q && *q!='\n' && nopen )
    {
        p = ++q;
        while ( *q && isalnum(*q) ) q++;
        n = q-p;
        if ( *q!='=' || !n )
        {
            // wrong format
            while ( *q && *q!='\n' ) q++;
            kstring_t tmp = {0,0,0};
            kputsn(line,q-line,&tmp);
            fprintf(stderr,"Could not parse the header line: \"%s\"\n", tmp.s);
            free(tmp.s);
            *len = q-line+1;
            bcf_hrec_destroy(hrec);
            return NULL;
        }
        bcf_hrec_add_key(hrec, p, q-p);
        p = ++q;
        int quoted = *p=='"' ? 1 : 0;
        if ( quoted ) p++, q++;
        while (1)
        {
            if ( !*q ) break;
            if ( quoted ) { if ( *q=='"' && !is_escaped(p,q) ) break; }
            else
            {
                if ( *q=='<' ) nopen++;
                if ( *q=='>' ) nopen--;
                if ( !nopen ) break;
                if ( *q==',' && nopen==1 ) break;
            }
            q++;
        }
        bcf_hrec_set_val(hrec, hrec->nkeys-1, p, q-p, quoted);
        if ( quoted ) q++;
        if ( *q=='>' ) { nopen--; q++; }
    }
    *len = q-line+1;
    return hrec;
}